

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O3

void __thiscall PatternGridHeader::soloTrack(PatternGridHeader *this,int track)

{
  Int IVar1;
  Flags _t1;
  
  IVar1 = 1 << ((byte)track & 0x1f);
  _t1.i = 0xf;
  if (IVar1 != (this->mTrackFlags).i) {
    _t1.i = IVar1;
  }
  (this->mTrackFlags).i = _t1.i;
  outputChanged(this,_t1);
  QWidget::update();
  return;
}

Assistant:

void PatternGridHeader::soloTrack(int track) {
    auto soloFlag = (ChannelOutput::Flag)(1 << track);
    if (soloFlag == mTrackFlags) {
        // unsolo
        mTrackFlags = ChannelOutput::AllOn;
    } else {
        // solo
        mTrackFlags = soloFlag;
    }
    emit outputChanged(mTrackFlags);
    update();
}